

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

AggregateFunction *
duckdb::GetHistogramBinFunction<duckdb::HistogramFunctor,unsigned_int,duckdb::HistogramRange>
          (LogicalType *type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  LogicalType *pLVar2;
  LogicalType struct_type;
  char *function_name;
  allocator_type *in_stack_fffffffffffffe38;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe40;
  iterator in_stack_fffffffffffffe48;
  size_type in_stack_fffffffffffffe50;
  aggregate_initialize_t in_stack_fffffffffffffec8;
  LogicalType *return_type;
  vector<duckdb::LogicalType,_true> *arguments;
  string *name;
  AggregateFunction *this;
  aggregate_update_t in_stack_ffffffffffffff00;
  aggregate_finalize_t in_stack_ffffffffffffff10;
  aggregate_simple_update_t in_stack_ffffffffffffff18;
  bind_aggregate_function_t in_stack_ffffffffffffff20;
  aggregate_destructor_t in_stack_ffffffffffffff28;
  aggregate_statistics_t in_stack_ffffffffffffff30;
  aggregate_window_t in_stack_ffffffffffffff38;
  aggregate_serialize_t serialize;
  aggregate_deserialize_t deserialize;
  undefined1 local_91 [49];
  LogicalType local_60 [24];
  LogicalType local_48 [24];
  LogicalType local_30 [24];
  vector<duckdb::LogicalType,_true> *local_18;
  LogicalType *local_10;
  
  local_18 = (vector<duckdb::LogicalType,_true> *)0xf2cb2c;
  this = in_RDI;
  local_10 = in_RSI;
  duckdb::LogicalType::LogicalType(local_48,in_RSI);
  duckdb::LogicalType::LogicalType(local_60,UBIGINT);
  duckdb::LogicalType::MAP(local_30,local_48,local_60);
  duckdb::LogicalType::~LogicalType(local_60);
  duckdb::LogicalType::~LogicalType(local_48);
  name = (string *)local_91;
  arguments = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_91 + 1),(char *)arguments,(allocator *)name);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff10,local_10);
  pLVar2 = (LogicalType *)&stack0xffffffffffffff28;
  duckdb::LogicalType::LIST(pLVar2);
  serialize = (aggregate_serialize_t)&stack0xffffffffffffff10;
  deserialize = (aggregate_deserialize_t)0x2;
  return_type = (LogicalType *)&stack0xffffffffffffff07;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xb4402e);
  iVar1._M_len = in_stack_fffffffffffffe50;
  iVar1._M_array = in_stack_fffffffffffffe48;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffe40,iVar1,in_stack_fffffffffffffe38);
  AggregateFunction::AggregateFunction
            (this,name,arguments,return_type,(aggregate_size_t)&stack0xfffffffffffffe38,
             in_stack_fffffffffffffec8,in_stack_ffffffffffffff00,(aggregate_combine_t)pLVar2,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,serialize
             ,deserialize);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xb440fd);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xb4410a);
  pLVar2 = (LogicalType *)&stack0xffffffffffffff40;
  do {
    pLVar2 = pLVar2 + -0x18;
    duckdb::LogicalType::~LogicalType(pLVar2);
  } while (pLVar2 != (LogicalType *)&stack0xffffffffffffff10);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  duckdb::LogicalType::~LogicalType(local_30);
  return in_RDI;
}

Assistant:

static AggregateFunction GetHistogramBinFunction(const LogicalType &type) {
	using STATE_TYPE = HistogramBinState<T>;

	const char *function_name = HIST::EXACT ? "histogram_exact" : "histogram";

	auto struct_type = LogicalType::MAP(type, LogicalType::UBIGINT);
	return AggregateFunction(
	    function_name, {type, LogicalType::LIST(type)}, struct_type, AggregateFunction::StateSize<STATE_TYPE>,
	    AggregateFunction::StateInitialize<STATE_TYPE, HistogramBinFunction>, HistogramBinUpdateFunction<OP, T, HIST>,
	    AggregateFunction::StateCombine<STATE_TYPE, HistogramBinFunction>, HistogramBinFinalizeFunction<OP, T>, nullptr,
	    nullptr, AggregateFunction::StateDestroy<STATE_TYPE, HistogramBinFunction>);
}